

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O1

bool __thiscall QPDFObjectHandle::isNameAndEquals(QPDFObjectHandle *this,string *name)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  string local_48;
  
  bVar1 = isName(this);
  if (bVar1) {
    getName_abi_cxx11_(&local_48,this);
    if (local_48._M_string_length == name->_M_string_length) {
      if (local_48._M_string_length == 0) {
        bVar3 = true;
      }
      else {
        iVar2 = bcmp(local_48._M_dataplus._M_p,(name->_M_dataplus)._M_p,local_48._M_string_length);
        bVar3 = iVar2 == 0;
      }
      goto LAB_001c3cad;
    }
  }
  bVar3 = false;
LAB_001c3cad:
  if ((bVar1) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2)) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool
QPDFObjectHandle::isNameAndEquals(std::string const& name) const
{
    return isName() && (getName() == name);
}